

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

string * __thiscall
duckdb::Time::ToString_abi_cxx11_(string *__return_storage_ptr__,Time *this,dtime_t time)

{
  undefined1 auVar1 [16];
  int minute;
  idx_t length;
  char *data;
  Time *pTVar2;
  int second;
  int micros;
  char micro_buffer [6];
  char local_3e [6];
  long local_38;
  
  local_38 = (long)(int)((long)this / 3600000000);
  pTVar2 = this + local_38 * -3600000000;
  minute = (int)((long)pTVar2 / 60000000);
  auVar1 = SEXT816((long)(pTVar2 + (long)minute * -60000000)) * SEXT816(0x431bde82d7b634db);
  second = (int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f);
  micros = (int)(pTVar2 + (long)minute * -60000000) + second * -1000000;
  length = TimeToStringCast::MicrosLength(micros,local_3e);
  data = (char *)operator_new__(length);
  TimeToStringCast::Format(data,length,(int32_t)local_38,minute,second,micros,local_3e);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,data,data + length);
  operator_delete__(data);
  return __return_storage_ptr__;
}

Assistant:

string Time::ToString(dtime_t time) {
	int32_t time_units[4];
	Time::Convert(time, time_units[0], time_units[1], time_units[2], time_units[3]);

	char micro_buffer[6];
	auto length = TimeToStringCast::Length(time_units, micro_buffer);
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(length);
	TimeToStringCast::Format(buffer.get(), length, time_units, micro_buffer);
	return string(buffer.get(), length);
}